

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void wtree_sym(wtree_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  long lVar1;
  uint uVar2;
  wave_object pwVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long local_48;
  long local_40;
  
  if (0 < len_cA) {
    pwVar3 = wt->wave;
    uVar2 = pwVar3->lpd_len;
    local_48 = 1;
    local_40 = 0x7fffffff0;
    uVar8 = 0;
    do {
      cA[uVar8] = 0.0;
      cD[uVar8] = 0.0;
      if (0 < (int)uVar2) {
        lVar1 = uVar8 * 2 + 1;
        lVar7 = 0;
        lVar4 = 0;
        lVar9 = local_48;
        do {
          if (lVar9 < N && -1 < lVar9) {
            pdVar6 = pwVar3->lpd + lVar4;
            pdVar5 = inp + (lVar1 - lVar4);
LAB_00104172:
            cA[uVar8] = *pdVar6 * *pdVar5 + cA[uVar8];
            cD[uVar8] = *(double *)((long)pwVar3->hpd + lVar7) * *pdVar5 + cD[uVar8];
          }
          else {
            if (lVar9 < 0) {
              pdVar6 = pwVar3->lpd + lVar4;
              pdVar5 = (double *)((long)inp + lVar7 + ((local_40 << 0x1d) >> 0x1d));
              goto LAB_00104172;
            }
            if (N <= lVar9) {
              pdVar6 = (double *)((long)pwVar3->lpd + lVar7);
              pdVar5 = inp + (long)(N * 2 - (int)lVar1) + lVar4 + -1;
              goto LAB_00104172;
            }
          }
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + 8;
          lVar9 = lVar9 + -1;
        } while ((ulong)uVar2 * 8 - lVar7 != 0);
      }
      uVar8 = uVar8 + 1;
      local_40 = local_40 + 0x7fffffff0;
      local_48 = local_48 + 2;
    } while (uVar8 != (uint)len_cA);
  }
  return;
}

Assistant:

static void wtree_sym(wtree_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int i, l, t, len_avg;

	len_avg = wt->wave->lpd_len;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + 1;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= 0 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0) {
				cA[i] += wt->wave->lpd[l] * inp[-t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[-t + l - 1];
			}
			else if ((t - l) >= N) {
				cA[i] += wt->wave->lpd[l] * inp[2 * N - t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[2 * N - t + l - 1];
			}

		}
	}


}